

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O0

float min_elem(float *arr,int length)

{
  int i;
  float min;
  int length_local;
  float *arr_local;
  
  min = *arr;
  for (i = 1; i < length; i = i + 1) {
    if ((arr[i] < min) && (0.001 < arr[i])) {
      min = arr[i];
    }
  }
  return min;
}

Assistant:

float min_elem(float* arr, int length)
{
  float min = arr[0];
  for (int i = 1; i < length; i++)
    if (arr[i] < min && arr[i] > 0.001)
      min = arr[i];
  return min;
}